

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O3

void check_BF(Bframe *bf68k)

{
  Bframe *pBVar1;
  
  error("checkBF:not BF1");
  if ((*(ushort *)&bf68k->field_0x2 >> 9 & 1) == 0) {
    if ((bf68k->ivar & 1) != 0) {
      error("IVAR is ODD in a BF");
      return;
    }
    for (pBVar1 = (Bframe *)((ulong)((uint)bf68k->ivar * 2) + (long)Stackspace);
        pBVar1 <= bf68k + -1; pBVar1 = pBVar1 + 1) {
      if (0x1fff < *(ushort *)&pBVar1->field_0x2) {
        warn("CheckBF:Stack-bits set in IVAR");
      }
    }
  }
  return;
}

Assistant:

void check_BF(Bframe *bf68k) {
  Bframe *iptr68k;

  /* For starterd, it must BE a BF */
  if (bf68k->flags != STK_BF) error("checkBF:not BF1");

  /* If the frame is residual (whatever that means), it's OK */
  if (bf68k->residual == T)
    return;
  else {
    if (bf68k->ivar & 1)
      error("IVAR is ODD in a BF");
    else
      for (iptr68k = (Bframe *)NativeAligned4FromStackOffset(bf68k->ivar);
           iptr68k <= (Bframe *)(((DLword *)bf68k) - 2); iptr68k++) /* inc 2DLword */
      {
        /* Make sure none of the "ivar" slots have stack-type */
        /* bits set. */
        if (iptr68k->flags != STK_NOTFLG) warn("CheckBF:Stack-bits set in IVAR");
      }
  }

}